

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_patchclose(FuncState *fs,int list,int level)

{
  Instruction *pIVar1;
  uint uVar2;
  
  if (list != -1) {
    pIVar1 = fs->f->code;
    do {
      uVar2 = pIVar1[list];
      pIVar1[list] = uVar2 & 0xffffc03f | level * 0x40 + 0x40U & 0x3fc0;
      uVar2 = uVar2 >> 0xe;
      list = list + -0x1fffe + uVar2;
      if (uVar2 == 0x1fffe) {
        list = -1;
      }
    } while (list != -1);
  }
  return;
}

Assistant:

void luaK_patchclose(FuncState *fs, int list, int level) {
    level++;  /* argument is +1 to reserve 0 as non-op */
    for (; list != NO_JUMP; list = getjump(fs, list)) {
        lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                   (GETARG_A(fs->f->code[list]) == 0 ||
                    GETARG_A(fs->f->code[list]) >= level));
        SETARG_A(fs->f->code[list], level);
    }
}